

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.h
# Opt level: O1

int __thiscall hierarchy_info::init(hierarchy_info *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  char cVar2;
  kmp_uint32 *pkVar3;
  bool bVar4;
  uint uVar5;
  undefined8 in_RAX;
  undefined7 uVar8;
  kmp_uint32 *pkVar6;
  long lVar7;
  uint in_EDX;
  uint uVar9;
  ulong uVar10;
  EVP_PKEY_CTX *pEVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  kmp_uint32 kVar15;
  long lVar16;
  
  uVar8 = (undefined7)((ulong)in_RAX >> 8);
  iVar14 = (int)CONCAT71(uVar8,1);
  LOCK();
  cVar2 = this->uninitialized;
  if (cVar2 == '\x01') {
    this->uninitialized = '\x02';
  }
  else {
    iVar14 = (int)CONCAT71(uVar8,cVar2);
  }
  UNLOCK();
  if (cVar2 == '\x01') {
    this->resizing = '\0';
    this->maxLevels = 7;
    this->depth = 1;
    pkVar6 = (kmp_uint32 *)___kmp_allocate(0x38);
    this->numPerLevel = pkVar6;
    uVar9 = this->maxLevels;
    this->skipPerLevel = pkVar6 + uVar9;
    if ((ulong)uVar9 != 0) {
      uVar10 = 0;
      do {
        pkVar6[uVar10] = 1;
        (pkVar6 + uVar9)[uVar10] = 1;
        uVar10 = uVar10 + 1;
      } while (uVar10 < this->maxLevels);
    }
    if (ctx == (EVP_PKEY_CTX *)0x0) {
      *pkVar6 = 4;
      pkVar6[1] = in_EDX >> 2;
      if ((in_EDX & 3) != 0) {
        pkVar6[1] = (in_EDX >> 2) + 1;
      }
    }
    else {
      qsort(ctx,(long)(int)in_EDX,0x10c,__kmp_affinity_cmp_Address_labels);
      lVar7 = (long)*(int *)(ctx + 0x100);
      if (0 < lVar7) {
        pkVar6 = this->numPerLevel;
        pEVar11 = ctx + lVar7 * 4 + 0x7c;
        lVar12 = 0;
        do {
          kVar15 = 0;
          if (0 < (int)in_EDX) {
            iVar14 = -1;
            lVar16 = 0;
            do {
              if (iVar14 < *(int *)(pEVar11 + lVar16)) {
                iVar14 = *(int *)(pEVar11 + lVar16);
              }
              lVar16 = lVar16 + 0x10c;
            } while ((ulong)in_EDX * 0x10c - lVar16 != 0);
            kVar15 = iVar14 + 1;
          }
          pkVar6[lVar12] = kVar15;
          lVar12 = lVar12 + 1;
          pEVar11 = pEVar11 + -4;
        } while (lVar12 != lVar7);
      }
    }
    this->base_num_threads = in_EDX;
    uVar9 = this->maxLevels - 1;
    if (-1 < (int)uVar9) {
      uVar5 = this->depth;
      lVar7 = (ulong)uVar9 + 1;
      do {
        if (1 < uVar5 || this->numPerLevel[lVar7 + -1] != 1) {
          uVar5 = uVar5 + 1;
          this->depth = uVar5;
        }
        lVar12 = lVar7 + -1;
        bVar4 = 0 < lVar7;
        lVar7 = lVar12;
      } while (lVar12 != 0 && bVar4);
    }
    pkVar6 = this->numPerLevel;
    if (this->depth != 1) {
      uVar9 = in_EDX >> 2;
      if (in_EDX >> 2 < 5) {
        uVar9 = 4;
      }
      uVar10 = (ulong)uVar9;
      if (*pkVar6 != 1) {
        uVar10 = 4;
      }
      uVar13 = 0;
      do {
        uVar1 = uVar13 + 1;
        while( true ) {
          uVar9 = pkVar6[uVar13];
          if ((uVar9 <= (uint)uVar10) && (uVar13 != 0 || uVar9 < 5)) break;
          if ((uVar9 & 1) != 0) {
            pkVar6[uVar13] = uVar9 + 1;
          }
          pkVar6[uVar13] = pkVar6[uVar13] >> 1;
          if (pkVar6[uVar1] == 1) {
            this->depth = this->depth + 1;
          }
          pkVar6[uVar1] = pkVar6[uVar1] << 1;
        }
        uVar13 = uVar10 >> 1;
        if ((uint)uVar13 < 5) {
          uVar13 = 4;
        }
        if (*pkVar6 == 1) {
          uVar10 = uVar13;
        }
        uVar13 = uVar1;
      } while (uVar1 < this->depth - 1);
    }
    uVar10 = (ulong)this->depth;
    if (1 < this->depth) {
      pkVar3 = this->skipPerLevel;
      kVar15 = *pkVar3;
      uVar13 = 1;
      do {
        kVar15 = kVar15 * pkVar6[uVar13 - 1];
        pkVar3[uVar13] = kVar15;
        uVar13 = uVar13 + 1;
        uVar10 = (ulong)this->depth;
      } while (uVar13 < uVar10);
    }
    if ((uint)uVar10 < this->maxLevels) {
      pkVar6 = this->skipPerLevel;
      do {
        pkVar6[uVar10] = pkVar6[(int)uVar10 - 1] * 2;
        uVar10 = uVar10 + 1;
      } while (uVar10 < this->maxLevels);
    }
    iVar14 = (int)pkVar6;
    this->uninitialized = '\0';
  }
  else {
    do {
    } while (this->uninitialized != '\0');
  }
  return iVar14;
}

Assistant:

void init(AddrUnsPair *adr2os, int num_addrs) {
    kmp_int8 bool_result = KMP_COMPARE_AND_STORE_ACQ8(
        &uninitialized, not_initialized, initializing);
    if (bool_result == 0) { // Wait for initialization
      while (TCR_1(uninitialized) != initialized)
        KMP_CPU_PAUSE();
      return;
    }
    KMP_DEBUG_ASSERT(bool_result == 1);

    /* Added explicit initialization of the data fields here to prevent usage of
       dirty value observed when static library is re-initialized multiple times
       (e.g. when non-OpenMP thread repeatedly launches/joins thread that uses
       OpenMP). */
    depth = 1;
    resizing = 0;
    maxLevels = 7;
    numPerLevel =
        (kmp_uint32 *)__kmp_allocate(maxLevels * 2 * sizeof(kmp_uint32));
    skipPerLevel = &(numPerLevel[maxLevels]);
    for (kmp_uint32 i = 0; i < maxLevels;
         ++i) { // init numPerLevel[*] to 1 item per level
      numPerLevel[i] = 1;
      skipPerLevel[i] = 1;
    }

    // Sort table by physical ID
    if (adr2os) {
      qsort(adr2os, num_addrs, sizeof(*adr2os),
            __kmp_affinity_cmp_Address_labels);
      deriveLevels(adr2os, num_addrs);
    } else {
      numPerLevel[0] = maxLeaves;
      numPerLevel[1] = num_addrs / maxLeaves;
      if (num_addrs % maxLeaves)
        numPerLevel[1]++;
    }

    base_num_threads = num_addrs;
    for (int i = maxLevels - 1; i >= 0;
         --i) // count non-empty levels to get depth
      if (numPerLevel[i] != 1 || depth > 1) // only count one top-level '1'
        depth++;

    kmp_uint32 branch = minBranch;
    if (numPerLevel[0] == 1)
      branch = num_addrs / maxLeaves;
    if (branch < minBranch)
      branch = minBranch;
    for (kmp_uint32 d = 0; d < depth - 1; ++d) { // optimize hierarchy width
      while (numPerLevel[d] > branch ||
             (d == 0 && numPerLevel[d] > maxLeaves)) { // max 4 on level 0!
        if (numPerLevel[d] & 1)
          numPerLevel[d]++;
        numPerLevel[d] = numPerLevel[d] >> 1;
        if (numPerLevel[d + 1] == 1)
          depth++;
        numPerLevel[d + 1] = numPerLevel[d + 1] << 1;
      }
      if (numPerLevel[0] == 1) {
        branch = branch >> 1;
        if (branch < 4)
          branch = minBranch;
      }
    }

    for (kmp_uint32 i = 1; i < depth; ++i)
      skipPerLevel[i] = numPerLevel[i - 1] * skipPerLevel[i - 1];
    // Fill in hierarchy in the case of oversubscription
    for (kmp_uint32 i = depth; i < maxLevels; ++i)
      skipPerLevel[i] = 2 * skipPerLevel[i - 1];

    uninitialized = initialized; // One writer
  }